

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O2

QSharedPointer<QColorDialogOptions> QColorDialogOptions::create(void)

{
  QColorDialogOptionsPrivate *pQVar1;
  QColorDialogOptionsPrivate *pQVar2;
  Data *extraout_RDX;
  DestroyerFn in_RSI;
  totally_ordered_wrapper<QColorDialogOptions_*> in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<QColorDialogOptions> QVar3;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined> result;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.value.ptr = (ColorDialogCombined *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (QColorDialogOptionsPrivate *)
           QtSharedPointer::
           ExternalRefCountWithContiguousData<(anonymous_namespace)::ColorDialogCombined>::create
                     ((NoCVType **)&local_28,in_RSI);
  pQVar2 = (QColorDialogOptionsPrivate *)&(local_28.value.ptr)->super_QColorDialogOptions;
  *(undefined8 *)&(local_28.value.ptr)->super_QColorDialogOptionsPrivate = 0;
  ((local_28.value.ptr)->super_QColorDialogOptionsPrivate).windowTitle.d.d = (Data *)0x0;
  ((local_28.value.ptr)->super_QColorDialogOptionsPrivate).windowTitle.d.ptr = (char16_t *)0x0;
  ((local_28.value.ptr)->super_QColorDialogOptionsPrivate).windowTitle.d.size = 0;
  ((local_28.value.ptr)->super_QColorDialogOptions).d =
       &(local_28.value.ptr)->super_QColorDialogOptionsPrivate;
  if (local_28.value.ptr == (ColorDialogCombined *)0x0) {
    pQVar2 = (QColorDialogOptionsPrivate *)0x0;
  }
  (pQVar1->windowTitle).d.d =
       (Data *)QtSharedPointer::
               ExternalRefCountWithContiguousData<(anonymous_namespace)::ColorDialogCombined>::
               deleter;
  (in_RDI.ptr)->d = pQVar2;
  in_RDI.ptr[1].d = pQVar1;
  local_28.value.ptr = (ColorDialogCombined *)0x0;
  local_28.d = (Data *)0x0;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined>::~QSharedPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar3.d = extraout_RDX;
    QVar3.value.ptr = in_RDI.ptr;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer<QColorDialogOptions> QColorDialogOptions::create()
{
    return QSharedPointer<ColorDialogCombined>::create();
}